

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O1

TCPConnection * __thiscall
ProtocolTCP::NewClient
          (ProtocolTCP *this,InterfaceMAC *mac,uint8_t *remoteAddress,uint16_t remotePort,
          uint16_t localPort)

{
  int iVar1;
  TCPConnection *in_RAX;
  size_t sVar2;
  undefined1 *puVar3;
  long lVar4;
  ulong uVar5;
  
  puVar3 = &this->field_0x8;
  lVar4 = 0;
  while( true ) {
    iVar1 = *(int *)(&this->field_0x0 + lVar4 * 0x370);
    if (iVar1 == 0) {
      in_RAX = (TCPConnection *)(&this->field_0x0 + lVar4 * 0x370);
      TCPConnection::Allocate(in_RAX,mac);
      in_RAX->LocalPort = localPort;
      in_RAX->SequenceNumber = 1;
      in_RAX->MaxSequenceTx = 0x401;
      sVar2 = ProtocolIPv4::AddressSize(this->IP);
      if (sVar2 != 0) {
        uVar5 = 0;
        do {
          puVar3[uVar5] = remoteAddress[uVar5];
          uVar5 = uVar5 + 1;
          sVar2 = ProtocolIPv4::AddressSize(this->IP);
        } while (uVar5 < sVar2);
      }
      in_RAX->RemotePort = remotePort;
    }
    if (iVar1 == 0) break;
    lVar4 = lVar4 + 1;
    puVar3 = puVar3 + 0x370;
    if (lVar4 == 5) {
      return (TCPConnection *)0x0;
    }
  }
  return in_RAX;
}

Assistant:

TCPConnection* ProtocolTCP::NewClient(InterfaceMAC* mac,
                                      const uint8_t* remoteAddress,
                                      uint16_t remotePort,
                                      uint16_t localPort)
{
    size_t i;
    size_t j;

    for (i = 0; i < TCP_MAX_CONNECTIONS; i++)
    {
        TCPConnection& connection = ConnectionList[i];
        if (connection.State == TCPConnection::CLOSED)
        {
            connection.Allocate(mac);
            connection.LocalPort = localPort;
            connection.SequenceNumber = 1;
            connection.MaxSequenceTx = connection.SequenceNumber + 1024;
            for (j = 0; j < IP.AddressSize(); j++)
            {
                connection.RemoteAddress[j] = remoteAddress[j];
            }
            connection.RemotePort = remotePort;

            return &connection;
        }
    }

    return nullptr;
}